

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O2

void Gia_VtaPrintMemory(Vta_Man_t *p)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int level;
  Vec_Vec_t *p_00;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  
  lVar3 = (long)p->pGia->nObjs * 0xc;
  auVar11._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar11._0_8_ = lVar3;
  auVar11._12_4_ = 0x45300000;
  dVar14 = (auVar11._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
  dVar7 = sat_solver2_memory(p->pSat,1);
  dVar8 = sat_solver2_memory_proof(p->pSat);
  lVar3 = (long)p->nObjsAlloc * 0x10 + (long)p->nBins * 4;
  auVar12._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar12._0_8_ = lVar3;
  auVar12._12_4_ = 0x45300000;
  lVar4 = (long)p->vOrder->nCap << 2;
  auVar13._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar13._0_8_ = lVar4;
  auVar13._12_4_ = 0x45300000;
  dVar9 = Vec_VecMemoryInt((Vec_Vec_t *)p->vFrames);
  p_00 = (Vec_Vec_t *)p->vCores;
  lVar5 = (long)p->vSeenGla->nCap << 2;
  auVar15._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar15._0_8_ = lVar5;
  auVar15._12_4_ = 0x45300000;
  dVar10 = Vec_VecMemoryInt(p_00);
  lVar6 = (long)p->vAddedNew->nCap << 2;
  auVar16._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar16._0_8_ = lVar6;
  auVar16._12_4_ = 0x45300000;
  dVar9 = dVar7 + dVar14 + dVar8 +
          (auVar12._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0) +
          (auVar16._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0) +
          dVar10 + (auVar15._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0) +
                   dVar9 + (auVar13._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0) + 168.0;
  level = (int)p_00;
  Abc_Print(level,"%s =","Memory: AIG     ");
  bVar1 = NAN(dVar9);
  bVar2 = dVar9 == 0.0;
  dVar10 = (dVar14 * 100.0) / dVar9;
  if ((bVar2) && (!bVar1)) {
    dVar10 = 0.0;
  }
  dVar18 = (dVar7 * 100.0) / dVar9;
  if ((bVar2) && (!bVar1)) {
    dVar18 = 0.0;
  }
  dVar19 = (dVar8 * 100.0) / dVar9;
  if ((bVar2) && (!bVar1)) {
    dVar19 = 0.0;
  }
  dVar17 = (dVar9 * 100.0) / dVar9;
  if ((bVar2) && (!bVar1)) {
    dVar17 = 0.0;
  }
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar14 * 9.5367431640625e-07,dVar10);
  Abc_Print(level,"%s =","Memory: SAT     ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar7 * 9.5367431640625e-07,dVar18);
  Abc_Print(level,"%s =","Memory: Proof   ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar8 * 9.5367431640625e-07,dVar19);
  Abc_Print(level,"%s =","Memory: Map     ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n");
  Abc_Print(level,"%s =","Memory: Other   ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n");
  Abc_Print(level,"%s =","Memory: TOTAL   ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar9 * 9.5367431640625e-07,dVar17);
  return;
}

Assistant:

void Gia_VtaPrintMemory( Vta_Man_t * p )
{
    double memTot = 0;
    double memAig = Gia_ManObjNum(p->pGia) * sizeof(Gia_Obj_t);
    double memSat = sat_solver2_memory( p->pSat, 1 );
    double memPro = sat_solver2_memory_proof( p->pSat );
    double memMap = p->nObjsAlloc * sizeof(Vta_Obj_t) + p->nBins * sizeof(int);
    double memOth = sizeof(Vta_Man_t);
    memOth += Vec_IntCap(p->vOrder) * sizeof(int);
    memOth += Vec_VecMemoryInt( (Vec_Vec_t *)p->vFrames );
    memOth += Vec_BitCap(p->vSeenGla) * sizeof(int);
    memOth += Vec_VecMemoryInt( (Vec_Vec_t *)p->vCores );
    memOth += Vec_IntCap(p->vAddedNew) * sizeof(int);
    memTot = memAig + memSat + memPro + memMap + memOth;
    ABC_PRMP( "Memory: AIG     ", memAig, memTot );
    ABC_PRMP( "Memory: SAT     ", memSat, memTot );
    ABC_PRMP( "Memory: Proof   ", memPro, memTot );
    ABC_PRMP( "Memory: Map     ", memMap, memTot );
    ABC_PRMP( "Memory: Other   ", memOth, memTot );
    ABC_PRMP( "Memory: TOTAL   ", memTot, memTot );
}